

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glist.c
# Opt level: O0

glist_t glist_reverse(glist_t g)

{
  gnode_s *pgVar1;
  glist_t local_28;
  gnode_t *rev;
  gnode_t *nextgn;
  gnode_t *gn;
  glist_t g_local;
  
  local_28 = (glist_t)0x0;
  nextgn = g;
  while (nextgn != (gnode_t *)0x0) {
    pgVar1 = nextgn->next;
    nextgn->next = local_28;
    local_28 = nextgn;
    nextgn = pgVar1;
  }
  return local_28;
}

Assistant:

glist_t
glist_reverse(glist_t g)
{
    gnode_t *gn, *nextgn;
    gnode_t *rev;

    rev = NULL;
    for (gn = g; gn; gn = nextgn) {
        nextgn = gn->next;

        gn->next = rev;
        rev = gn;
    }

    return rev;
}